

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_poly.c
# Opt level: O1

void pair1poly_pipe_fini(void *arg)

{
  nni_aio_fini((nni_aio *)((long)arg + 0x18));
  nni_aio_fini((nni_aio *)((long)arg + 0x1e0));
  nni_aio_fini((nni_aio *)((long)arg + 0x570));
  nni_aio_fini((nni_aio *)((long)arg + 0x3a8));
  nni_msgq_fini(*(nni_msgq **)((long)arg + 0x10));
  return;
}

Assistant:

static void
pair1poly_pipe_fini(void *arg)
{
	pair1poly_pipe *p = arg;

	nni_aio_fini(&p->aio_send);
	nni_aio_fini(&p->aio_recv);
	nni_aio_fini(&p->aio_put);
	nni_aio_fini(&p->aio_get);
	nni_msgq_fini(p->send_queue);
}